

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O1

Matrix * __thiscall
LinearSystem::GetSolutionMatrix(Matrix *__return_storage_ptr__,LinearSystem *this)

{
  Permutation *this_00;
  Matrix *rhs;
  Permutation local_28;
  
  this_00 = ExtendedMatrix::GetMainColumnPermutation(&this->system_);
  Permutation::GetInverse(&local_28,this_00);
  rhs = ExtendedMatrix::GetExtensionMatrix(&this->system_);
  operator*(__return_storage_ptr__,&local_28,rhs);
  if (local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix LinearSystem::GetSolutionMatrix() const {
  return system_.GetMainColumnPermutation().GetInverse() * system_.GetExtensionMatrix();
}